

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O0

bool DirectiveMessage(ArgumentList *List,int flags)

{
  bool bVar1;
  CDirectiveMessage *this;
  CDirectiveMessage *Command;
  Type value;
  int flags_local;
  ArgumentList *List_local;
  
  if (flags == 1) {
    Command._0_4_ = Warning;
  }
  else if (flags == 2) {
    Command._0_4_ = Error;
  }
  else {
    if (flags != 3) {
      return false;
    }
    Command._0_4_ = Notice;
  }
  this = (CDirectiveMessage *)operator_new(0x38);
  CDirectiveMessage::CDirectiveMessage(this);
  bVar1 = CDirectiveMessage::Load(this,List,(Type)Command);
  if (bVar1) {
    AddAssemblerCommand((CAssemblerCommand *)this);
    List_local._7_1_ = true;
  }
  else {
    if (this != (CDirectiveMessage *)0x0) {
      (*(this->super_CAssemblerCommand)._vptr_CAssemblerCommand[1])();
    }
    List_local._7_1_ = false;
  }
  return List_local._7_1_;
}

Assistant:

bool DirectiveMessage(ArgumentList& List, int flags)
{
	CDirectiveMessage::Type value;

	switch (flags)
	{
	case DIRECTIVE_MSG_WARNING:		value = CDirectiveMessage::Type::Warning;	break;
	case DIRECTIVE_MSG_ERROR:		value = CDirectiveMessage::Type::Error;		break;
	case DIRECTIVE_MSG_NOTICE:		value = CDirectiveMessage::Type::Notice;	break;
	default: return false;
	}

	CDirectiveMessage* Command = new CDirectiveMessage();
	if (Command->Load(List,value) == false)
	{
		delete Command;
		return false;
	}

	AddAssemblerCommand(Command);
	return true;
}